

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONIterators.cpp
# Opt level: O0

json_iterator __thiscall JSONNode::find_nocase(JSONNode *this,json_string *name_t)

{
  JSONNode **starter;
  json_string *in_RDX;
  JSONNode **res;
  json_string *name_t_local;
  JSONNode *this_local;
  
  makeUniqueInternal((JSONNode *)name_t);
  starter = internalJSONNode::at_nocase(*(internalJSONNode **)name_t,in_RDX);
  if (starter == (JSONNode **)0x0) {
    end(this);
  }
  else {
    iterator::iterator((iterator *)this,starter);
  }
  return (json_iterator)(JSONNode **)this;
}

Assistant:

JSONNode::json_iterator JSONNode::find_nocase(const json_string & name_t) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("find_nocase"));
	   makeUniqueInternal();
	   if (JSONNode ** res = internal -> at_nocase(name_t)){
		  return ptr_to_json_iterator(res);
	   }
	   return end();
    }